

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_divull_m68k(CPUM68KState_conflict *env,int numr,int regr,uint32_t den)

{
  uint64_t uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  uint32_t rem;
  uint64_t quot;
  uint64_t num;
  uint32_t den_local;
  int regr_local;
  int numr_local;
  CPUM68KState_conflict *env_local;
  
  uVar1 = deposit64((ulong)env->dregs[numr],0x20,0x20,(ulong)env->dregs[regr]);
  if (den == 0) {
    raise_exception_ra(env,5,unaff_retaddr);
  }
  env->cc_c = 0;
  if (uVar1 / den < 0x100000000) {
    uVar2 = (uint32_t)(uVar1 / den);
    env->cc_z = uVar2;
    env->cc_n = uVar2;
    env->cc_v = 0;
    env->dregs[regr] = (uint32_t)(uVar1 % (ulong)den);
    env->dregs[numr] = uVar2;
  }
  else {
    env->cc_v = 0xffffffff;
    env->cc_z = 1;
  }
  return;
}

Assistant:

void HELPER(divull)(CPUM68KState *env, int numr, int regr, uint32_t den)
{
    uint64_t num = deposit64(env->dregs[numr], 32, 32, env->dregs[regr]);
    uint64_t quot;
    uint32_t rem;

    if (den == 0) {
        raise_exception_ra(env, EXCP_DIV0, GETPC());
    }
    quot = num / den;
    rem = num % den;

    env->cc_c = 0; /* always cleared, even if overflow */
    if (quot > 0xffffffffULL) {
        env->cc_v = -1;
        /*
         * real 68040 keeps N and unset Z on overflow,
         * whereas documentation says "undefined"
         */
        env->cc_z = 1;
        return;
    }
    env->cc_z = quot;
    env->cc_n = quot;
    env->cc_v = 0;

    /*
     * If Dq and Dr are the same, the quotient is returned.
     * therefore we set Dq last.
     */

    env->dregs[regr] = rem;
    env->dregs[numr] = quot;
}